

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall
ncnn::Crop::eval_crop_expr
          (Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,int *_woffset,
          int *_hoffset,int *_doffset,int *_coffset,int *_outw,int *_outh,int *_outd,int *_outc)

{
  size_type sVar1;
  int *piVar2;
  int *in_RCX;
  int *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int end;
  int start;
  int axis_1;
  int i_1;
  int axis;
  int i;
  int num_axis;
  int _axes4 [4];
  int *axes_ptr;
  int *ends_ptr;
  int *starts_ptr;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *bottom_blob;
  int er;
  vector<int,_std::allocator<int>_> _axes;
  vector<int,_std::allocator<int>_> _ends;
  vector<int,_std::allocator<int>_> _starts;
  vector<int,_std::allocator<int>_> *in_stack_000001e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_000001e8;
  int local_1e0;
  int local_1dc;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int local_1c0;
  int local_1bc;
  int local_1b0;
  int local_1ac;
  int local_1a0;
  int local_19c;
  int local_190;
  int local_18c;
  int local_180;
  int local_17c;
  int local_170;
  int local_16c;
  int local_160;
  int local_15c;
  int local_150;
  int local_14c;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8 [6];
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  const_reference local_a0;
  undefined4 local_98;
  int local_84;
  vector<int,_std::allocator<int>_> local_80 [3];
  int *local_38;
  int *local_30;
  int *local_28;
  int *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x9344cc);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x9344d9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x9344e6);
  local_84 = eval_list_expression((string *)_outw,in_stack_000001e8,in_stack_000001e0);
  if (local_84 == 0) {
    local_84 = eval_list_expression((string *)_outw,in_stack_000001e8,in_stack_000001e0);
    if (local_84 == 0) {
      local_84 = eval_list_expression((string *)_outw,in_stack_000001e8,in_stack_000001e0);
      if (local_84 == 0) {
        local_a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
        local_a4 = local_a0->w;
        local_a8 = local_a0->h;
        local_ac = local_a0->d;
        local_b0 = local_a0->c;
        local_b4 = local_a0->dims;
        *local_20 = 0;
        *local_28 = 0;
        *local_30 = 0;
        *local_38 = 0;
        *in_stack_00000008 = local_a4;
        *in_stack_00000010 = local_a8;
        *in_stack_00000018 = local_ac;
        *in_stack_00000020 = local_b0;
        local_c0 = std::vector<int,_std::allocator<int>_>::data
                             ((vector<int,_std::allocator<int>_> *)0x934742);
        local_c8 = std::vector<int,_std::allocator<int>_>::data
                             ((vector<int,_std::allocator<int>_> *)0x934757);
        local_d0 = std::vector<int,_std::allocator<int>_>::data
                             ((vector<int,_std::allocator<int>_> *)0x93476c);
        local_e8[0] = 0;
        local_e8[1] = 1;
        local_e8[2] = 2;
        local_e8[3] = 3;
        sVar1 = std::vector<int,_std::allocator<int>_>::size(local_80);
        local_ec = (int)sVar1;
        if (local_ec == 0) {
          local_ec = local_b4;
        }
        else {
          for (local_f0 = 0; local_f0 < local_ec; local_f0 = local_f0 + 1) {
            local_f4 = local_d0[local_f0];
            if (local_f4 < 0) {
              local_f4 = local_b4 + local_f4;
            }
            local_e8[local_f0] = local_f4;
          }
        }
        for (local_f8 = 0; local_f8 < local_ec; local_f8 = local_f8 + 1) {
          local_fc = local_e8[local_f8];
          local_100 = local_c0[local_f8];
          local_104 = local_c8[local_f8];
          if (local_b4 == 1) {
            if (local_100 == -0xe9) {
              local_100 = 0;
            }
            if (local_104 == -0xe9) {
              local_104 = local_a4;
            }
            if (local_100 < 0) {
              local_14c = local_a4 + local_100;
            }
            else {
              local_14c = local_100;
            }
            *local_20 = local_14c;
            if (local_104 < 1) {
              local_150 = local_a4 + local_104;
            }
            else {
              local_150 = local_104;
            }
            local_108 = local_150;
            piVar2 = std::min<int>(&local_a4,&local_108);
            *in_stack_00000008 = *piVar2 - *local_20;
          }
          if (local_b4 == 2) {
            if (local_fc == 0) {
              if (local_100 == -0xe9) {
                local_100 = 0;
              }
              if (local_104 == -0xe9) {
                local_104 = local_a8;
              }
              if (local_100 < 0) {
                local_15c = local_a8 + local_100;
              }
              else {
                local_15c = local_100;
              }
              *local_28 = local_15c;
              if (local_104 < 1) {
                local_160 = local_a8 + local_104;
              }
              else {
                local_160 = local_104;
              }
              local_10c = local_160;
              piVar2 = std::min<int>(&local_a8,&local_10c);
              *in_stack_00000010 = *piVar2 - *local_28;
            }
            if (local_fc == 1) {
              if (local_100 == -0xe9) {
                local_100 = 0;
              }
              if (local_104 == -0xe9) {
                local_104 = local_a4;
              }
              if (local_100 < 0) {
                local_16c = local_a4 + local_100;
              }
              else {
                local_16c = local_100;
              }
              *local_20 = local_16c;
              if (local_104 < 1) {
                local_170 = local_a4 + local_104;
              }
              else {
                local_170 = local_104;
              }
              local_110 = local_170;
              piVar2 = std::min<int>(&local_a4,&local_110);
              *in_stack_00000008 = *piVar2 - *local_20;
            }
          }
          if (local_b4 == 3) {
            if (local_fc == 0) {
              if (local_100 == -0xe9) {
                local_100 = 0;
              }
              if (local_104 == -0xe9) {
                local_104 = local_b0;
              }
              if (local_100 < 0) {
                local_17c = local_b0 + local_100;
              }
              else {
                local_17c = local_100;
              }
              *local_38 = local_17c;
              if (local_104 < 1) {
                local_180 = local_b0 + local_104;
              }
              else {
                local_180 = local_104;
              }
              local_114 = local_180;
              piVar2 = std::min<int>(&local_b0,&local_114);
              *in_stack_00000020 = *piVar2 - *local_38;
            }
            if (local_fc == 1) {
              if (local_100 == -0xe9) {
                local_100 = 0;
              }
              if (local_104 == -0xe9) {
                local_104 = local_a8;
              }
              if (local_100 < 0) {
                local_18c = local_a8 + local_100;
              }
              else {
                local_18c = local_100;
              }
              *local_28 = local_18c;
              if (local_104 < 1) {
                local_190 = local_a8 + local_104;
              }
              else {
                local_190 = local_104;
              }
              local_118 = local_190;
              piVar2 = std::min<int>(&local_a8,&local_118);
              *in_stack_00000010 = *piVar2 - *local_28;
            }
            if (local_fc == 2) {
              if (local_100 == -0xe9) {
                local_100 = 0;
              }
              if (local_104 == -0xe9) {
                local_104 = local_a4;
              }
              if (local_100 < 0) {
                local_19c = local_a4 + local_100;
              }
              else {
                local_19c = local_100;
              }
              *local_20 = local_19c;
              if (local_104 < 1) {
                local_1a0 = local_a4 + local_104;
              }
              else {
                local_1a0 = local_104;
              }
              local_11c = local_1a0;
              piVar2 = std::min<int>(&local_a4,&local_11c);
              *in_stack_00000008 = *piVar2 - *local_20;
            }
          }
          if (local_b4 == 4) {
            if (local_fc == 0) {
              if (local_100 == -0xe9) {
                local_100 = 0;
              }
              if (local_104 == -0xe9) {
                local_104 = local_b0;
              }
              if (local_100 < 0) {
                local_1ac = local_b0 + local_100;
              }
              else {
                local_1ac = local_100;
              }
              *local_38 = local_1ac;
              if (local_104 < 1) {
                local_1b0 = local_b0 + local_104;
              }
              else {
                local_1b0 = local_104;
              }
              local_120 = local_1b0;
              piVar2 = std::min<int>(&local_b0,&local_120);
              *in_stack_00000020 = *piVar2 - *local_38;
            }
            if (local_fc == 1) {
              if (local_100 == -0xe9) {
                local_100 = 0;
              }
              if (local_104 == -0xe9) {
                local_104 = local_ac;
              }
              if (local_100 < 0) {
                local_1bc = local_ac + local_100;
              }
              else {
                local_1bc = local_100;
              }
              *local_30 = local_1bc;
              if (local_104 < 1) {
                local_1c0 = local_ac + local_104;
              }
              else {
                local_1c0 = local_104;
              }
              local_124 = local_1c0;
              piVar2 = std::min<int>(&local_ac,&local_124);
              *in_stack_00000018 = *piVar2 - *local_30;
            }
            if (local_fc == 2) {
              if (local_100 == -0xe9) {
                local_100 = 0;
              }
              if (local_104 == -0xe9) {
                local_104 = local_a8;
              }
              in_stack_fffffffffffffe34 = local_100;
              if (local_100 < 0) {
                in_stack_fffffffffffffe34 = local_a8 + local_100;
              }
              *local_28 = in_stack_fffffffffffffe34;
              in_stack_fffffffffffffe30 = local_104;
              if (local_104 < 1) {
                in_stack_fffffffffffffe30 = local_a8 + local_104;
              }
              local_128 = in_stack_fffffffffffffe30;
              piVar2 = std::min<int>(&local_a8,&local_128);
              *in_stack_00000010 = *piVar2 - *local_28;
            }
            if (local_fc == 3) {
              if (local_100 == -0xe9) {
                local_100 = 0;
              }
              if (local_104 == -0xe9) {
                local_104 = local_a4;
              }
              if (local_100 < 0) {
                local_1dc = local_a4 + local_100;
              }
              else {
                local_1dc = local_100;
              }
              *local_20 = local_1dc;
              if (local_104 < 1) {
                local_1e0 = local_a4 + local_104;
              }
              else {
                local_1e0 = local_104;
              }
              local_12c = local_1e0;
              piVar2 = std::min<int>(&local_a4,&local_12c);
              *in_stack_00000008 = *piVar2 - *local_20;
            }
          }
        }
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  local_98 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  return local_4;
}

Assistant:

int Crop::eval_crop_expr(const std::vector<Mat>& bottom_blobs, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    std::vector<int> _starts;
    std::vector<int> _ends;
    std::vector<int> _axes;
    int er = eval_list_expression(starts_expr, bottom_blobs, _starts);
    if (er != 0)
        return -1;

    er = eval_list_expression(ends_expr, bottom_blobs, _ends);
    if (er != 0)
        return -1;

    er = eval_list_expression(axes_expr, bottom_blobs, _axes);
    if (er != 0)
        return -1;

    // NCNN_LOGE("%d %d %d", _starts[0], _ends[0], _axes[0]);

    const Mat& bottom_blob = bottom_blobs[0];
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int dims = bottom_blob.dims;

    _woffset = 0;
    _hoffset = 0;
    _doffset = 0;
    _coffset = 0;
    _outw = w;
    _outh = h;
    _outd = d;
    _outc = channels;

    const int* starts_ptr = _starts.data();
    const int* ends_ptr = _ends.data();
    const int* axes_ptr = _axes.data();

    int _axes4[4] = {0, 1, 2, 3};
    int num_axis = (int)_axes.size();
    if (num_axis == 0)
    {
        num_axis = dims;
    }
    else
    {
        for (int i = 0; i < num_axis; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;
            _axes4[i] = axis;
        }
    }

    for (int i = 0; i < num_axis; i++)
    {
        int axis = _axes4[i];
        int start = starts_ptr[i];
        int end = ends_ptr[i];

        if (dims == 1) // axis == 0
        {
            if (start == -233) start = 0;
            if (end == -233) end = w;
            _woffset = start >= 0 ? start : w + start;
            _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
        }
        if (dims == 2)
        {
            if (axis == 0)
            {
                if (start == -233) start = 0;
                if (end == -233) end = h;
                _hoffset = start >= 0 ? start : h + start;
                _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
            }
            if (axis == 1)
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
        }
        if (dims == 3)
        {
            if (axis == 0)
            {
                if (start == -233) start = 0;
                if (end == -233) end = channels;
                _coffset = start >= 0 ? start : channels + start;
                _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
            }
            if (axis == 1)
            {
                if (start == -233) start = 0;
                if (end == -233) end = h;
                _hoffset = start >= 0 ? start : h + start;
                _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
            }
            if (axis == 2)
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
        }
        if (dims == 4)
        {
            if (axis == 0)
            {
                if (start == -233) start = 0;
                if (end == -233) end = channels;
                _coffset = start >= 0 ? start : channels + start;
                _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
            }
            if (axis == 1)
            {
                if (start == -233) start = 0;
                if (end == -233) end = d;
                _doffset = start >= 0 ? start : d + start;
                _outd = std::min(d, end > 0 ? end : d + end) - _doffset;
            }
            if (axis == 2)
            {
                if (start == -233) start = 0;
                if (end == -233) end = h;
                _hoffset = start >= 0 ? start : h + start;
                _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
            }
            if (axis == 3)
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
        }
    }

    return 0;
}